

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

NamespaceDeclaration * __thiscall
QXmlStreamWriterPrivate::addExtraNamespace
          (QXmlStreamWriterPrivate *this,QAnyStringView namespaceUri,QAnyStringView prefix)

{
  qsizetype *pqVar1;
  long lVar2;
  byte bVar3;
  bool bVar4;
  undefined7 extraout_var;
  long lVar5;
  NamespaceDeclaration *pNVar6;
  ushort *puVar7;
  long lVar8;
  size_t sVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  QAnyStringView rhs;
  QAnyStringView rhs_00;
  QAnyStringView rhs_01;
  QAnyStringView string;
  QAnyStringView string_00;
  XmlStringRef local_d0;
  QMessageLogger local_b8;
  QString local_98;
  QMessageLogger local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  rhs.m_size = 0x4000000000000003;
  rhs.field_0.m_data_utf8 = "xml";
  bVar4 = QAnyStringView::equal(prefix,rhs);
  uVar10 = CONCAT71(extraout_var,bVar4) & 0xffffffff;
  rhs_00.m_size = 0x4000000000000024;
  rhs_00.field_0.m_data_utf8 = "http://www.w3.org/XML/1998/namespace";
  bVar4 = QAnyStringView::equal(namespaceUri,rhs_00);
  bVar3 = (byte)uVar10;
  string_00.m_size._1_7_ = (undefined7)(uVar10 >> 8);
  string_00.m_size._0_1_ = bVar3 ^ 1 | bVar4;
  if ((byte)string_00.m_size == 0) {
    addExtraNamespace();
  }
  else if (bVar3 == 0 && bVar4) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    string_00.field_0.m_data = (void *)prefix.m_size;
    QtPrivate::convertToQString(&local_58,(QtPrivate *)prefix.field_0.m_data_utf8,string_00);
    local_78.context.version = 2;
    local_78.context._4_8_ = 0;
    local_78.context._12_8_ = 0;
    local_78.context.function._4_4_ = 0;
    local_78.context.category = "default";
    puVar7 = QString::utf16(&local_58);
    QMessageLogger::warning
              (&local_78,
               "The prefix \'%ls\' must not be bound to namespace name \'http://www.w3.org/XML/1998/namespace\' which \'xml\' is already bound to"
               ,puVar7);
    addExtraNamespace();
  }
  sVar9 = 0x400000000000001d;
  rhs_01.m_size = 0x400000000000001d;
  rhs_01.field_0.m_data_utf8 = "http://www.w3.org/2000/xmlns/";
  bVar4 = QAnyStringView::equal(namespaceUri,rhs_01);
  if (bVar4) {
    local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    string.m_size = sVar9;
    string.field_0.m_data = (void *)prefix.m_size;
    QtPrivate::convertToQString(&local_98,(QtPrivate *)prefix.field_0.m_data_utf8,string);
    local_b8.context.version = 2;
    local_b8.context._4_8_ = 0;
    local_b8.context._12_8_ = 0;
    local_b8.context.function._4_4_ = 0;
    local_b8.context.category = "default";
    puVar7 = QString::utf16(&local_98);
    QMessageLogger::warning
              (&local_b8,
               "The prefix \'%ls\' must not be bound to namespace name \'http://www.w3.org/2000/xmlns/\'"
               ,puVar7);
    addExtraNamespace();
  }
  lVar8 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos;
  lVar2 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.cap;
  if (lVar2 <= lVar8 + 1) {
    lVar8 = lVar8 + 2;
    lVar5 = lVar2 * 2;
    if (lVar8 != lVar5 && SBORROW8(lVar8,lVar5) == lVar8 + lVar2 * -2 < 0) {
      lVar5 = lVar8;
    }
    (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.cap = lVar5;
    pNVar6 = (NamespaceDeclaration *)
             realloc((this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data,lVar5 * 0x30
                    );
    (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data = pNVar6;
    if (pNVar6 == (NamespaceDeclaration *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        qBadAlloc();
      }
      goto LAB_003a3a05;
    }
  }
  pNVar6 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data;
  lVar8 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos + 1;
  (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos = lVar8;
  pqVar1 = &pNVar6[lVar8].namespaceUri.m_pos;
  *pqVar1 = 0;
  pqVar1[1] = 0;
  pqVar1 = &pNVar6[lVar8].prefix.m_size;
  *pqVar1 = 0;
  pqVar1[1] = 0;
  pNVar6[lVar8].prefix.m_string = (QString *)0x0;
  pNVar6[lVar8].prefix.m_pos = 0;
  QXmlStreamPrivateTagStack::addToStringStorage
            (&local_d0,&this->super_QXmlStreamPrivateTagStack,prefix);
  pNVar6[lVar8].prefix.m_size = local_d0.m_size;
  pNVar6[lVar8].prefix.m_string = local_d0.m_string;
  pNVar6[lVar8].prefix.m_pos = local_d0.m_pos;
  QXmlStreamPrivateTagStack::addToStringStorage
            (&local_d0,&this->super_QXmlStreamPrivateTagStack,namespaceUri);
  pNVar6[lVar8].namespaceUri.m_size = local_d0.m_size;
  pNVar6[lVar8].namespaceUri.m_string = local_d0.m_string;
  pNVar6[lVar8].namespaceUri.m_pos = local_d0.m_pos;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pNVar6 + lVar8;
  }
LAB_003a3a05:
  __stack_chk_fail();
}

Assistant:

QXmlStreamPrivateTagStack::NamespaceDeclaration &
QXmlStreamWriterPrivate::addExtraNamespace(QAnyStringView namespaceUri, QAnyStringView prefix)
{
    const bool prefixIsXml = prefix == "xml"_L1;
    const bool namespaceUriIsXml = namespaceUri == "http://www.w3.org/XML/1998/namespace"_L1;
    if (prefixIsXml && !namespaceUriIsXml) {
        qWarning("Reserved prefix 'xml' must not be bound to a different namespace name "
                 "than 'http://www.w3.org/XML/1998/namespace'");
    } else if (!prefixIsXml && namespaceUriIsXml) {
        const QString prefixString = prefix.toString();
        qWarning("The prefix '%ls' must not be bound to namespace name "
                 "'http://www.w3.org/XML/1998/namespace' which 'xml' is already bound to",
                 qUtf16Printable(prefixString));
    }
    if (namespaceUri == "http://www.w3.org/2000/xmlns/"_L1) {
        const QString prefixString = prefix.toString();
        qWarning("The prefix '%ls' must not be bound to namespace name "
                 "'http://www.w3.org/2000/xmlns/'",
                 qUtf16Printable(prefixString));
    }
    auto &namespaceDeclaration = namespaceDeclarations.push();
    namespaceDeclaration.prefix = addToStringStorage(prefix);
    namespaceDeclaration.namespaceUri = addToStringStorage(namespaceUri);
    return namespaceDeclaration;
}